

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31222d::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  ushort uVar1;
  ushort uVar2;
  size_t *psVar3;
  unsigned_short *puVar4;
  byte bVar5;
  size_t sVar6;
  ulong uVar7;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  half tmp;
  uint uVar16;
  size_t sVar17;
  bool bVar18;
  half candidate [16];
  ushort local_58 [20];
  
  uVar13 = this->_startValue;
  if (uVar13 < this->_endValue) {
    sVar6 = this->_numElements;
    psVar3 = this->_offset;
    puVar4 = this->_elements;
    do {
      uVar1 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)uVar13 & 0xff];
      uVar2 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)(uVar13 >> 8) & 0xff];
      psVar3[uVar13 - this->_startValue] = sVar6;
      uVar11 = (uint)uVar2 + (uint)uVar1;
      if (uVar11 == 0) {
        sVar6 = this->_numElements;
        sVar17 = 0;
      }
      else {
        sVar17 = (size_t)uVar11;
        uVar7 = 0;
        uVar12 = 0;
        uVar9 = uVar11;
        do {
          uVar9 = uVar9 - 1;
          uVar14 = 0;
          bVar5 = 0;
          do {
            bVar18 = (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)
                                   [uVar14 >> 8 & 0xffffff] +
                     (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)[uVar14 & 0xff] ==
                     uVar9;
            uVar16 = uVar12;
            if (bVar18) {
              uVar16 = (uint)uVar14;
            }
            if ((bool)(bVar18 & bVar5)) {
              bVar5 = 1;
              if (ABS(half::_toFloat[uVar13 & 0xffff].f - half::_toFloat[uVar14].f) <
                  ABS(half::_toFloat[uVar13 & 0xffff].f - half::_toFloat[uVar12 & 0xffff].f)) {
                uVar12 = (uint)uVar14;
              }
            }
            else {
              bVar5 = bVar5 | bVar18;
              uVar12 = uVar16;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x10000);
          local_58[uVar7] = (ushort)uVar12;
          uVar7 = uVar7 + 1;
        } while (uVar7 != sVar17);
        puVar8 = local_58;
        uVar7 = sVar17;
        uVar14 = 0;
        do {
          uVar10 = uVar14 + 1;
          if (uVar10 < sVar17) {
            uVar15 = 1;
            do {
              uVar1 = local_58[uVar14];
              uVar2 = puVar8[uVar15];
              if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 & 0xff] <
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 & 0xff]) {
                local_58[uVar14] = uVar2;
                puVar8[uVar15] = uVar1;
              }
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
          puVar8 = puVar8 + 1;
          uVar7 = uVar7 - 1;
          uVar14 = uVar10;
        } while (uVar10 != sVar17);
        sVar6 = this->_numElements;
        memcpy(puVar4 + sVar6,local_58,(ulong)(uVar11 * 2));
        sVar6 = sVar6 + (uVar11 - 1) + 1;
        this->_numElements = sVar6;
      }
      if (uVar13 == this->_endValue - 1) {
        this->_lastCandidateCount = sVar17;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < this->_endValue);
  }
  return;
}

Assistant:

void run(bool outputProgress)
    {
        half candidate[16];
        int  candidateCount = 0;

        for (size_t input=_startValue; input<_endValue; ++input) {

            int  numSetBits = countSetBits(input);
            half inputHalf, closestHalf;

            inputHalf.setBits(input);
            closestHalf.setBits(0);

            _offset[input - _startValue] = _numElements;

            // Gather candidates
            candidateCount = 0;
            for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                 --targetNumSetBits) {
                bool valueFound = false;

                for (int i=0; i<65536; ++i) {
                    if (countSetBits(i) != targetNumSetBits) continue;

                    if (!valueFound) {
                        closestHalf.setBits(i);
                        valueFound = true;
                    } else {
                        half tmpHalf;

                        tmpHalf.setBits(i);

                        if (fabs((float)inputHalf - (float)tmpHalf) < 
                            fabs((float)inputHalf - (float)closestHalf)) {
                            closestHalf = tmpHalf;
                        }
                    }
                }

                candidate[candidateCount] = closestHalf;
                candidateCount++;
            }

            // Sort candidates by increasing number of bits set
            for (int i=0; i<candidateCount; ++i) {
                for (int j=i+1; j<candidateCount; ++j) {

                    int   iCnt = countSetBits(candidate[i].bits());
                    int   jCnt = countSetBits(candidate[j].bits());

                    if (jCnt < iCnt) {
                        half tmp     = candidate[i];
                        candidate[i] = candidate[j];
                        candidate[j] = tmp;
                    }
                }
            }

            // Copy candidates to the data buffer;
            for (int i=0; i<candidateCount; ++i) {
                _elements[_numElements] = candidate[i].bits();
                _numElements++;
            }

            if (input == _endValue-1) {
                _lastCandidateCount = candidateCount;
            }
        }
    }